

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PedestriansWalkingAnEight.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_84dc2::PedestrianPlugIn::redraw
          (PedestrianPlugIn *this,float currentTime,float elapsedTime)

{
  uint *puVar1;
  Pedestrian *pPVar2;
  AbstractVehicle *pAVar3;
  undefined4 uVar4;
  PedestrianPlugIn *pPVar5;
  Color CVar6;
  char cVar7;
  int iVar8;
  PolylineSegmentedPathwaySingleRadius *pPVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar10;
  long lVar11;
  Color *color;
  pointer ppPVar12;
  char *pcVar13;
  ulong uVar14;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Da_05;
  float extraout_XMM0_Da_06;
  float extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  float extraout_XMM0_Db_05;
  float extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  Vec3 VVar19;
  Color textColor;
  ostringstream status;
  Vec3 local_228;
  Color local_218;
  PedestrianPlugIn *local_208;
  AbstractVehicle *local_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  AbstractVehicle *local_1d0;
  Vec3 local_1c8;
  Color local_1b8;
  uint auStack_1a0 [22];
  ios_base local_148 [268];
  Vec3 local_3c;
  
  pAVar3 = OpenSteer::OpenSteerDemo::selectedVehicle;
  local_200 = OpenSteer::OpenSteerDemo::vehicleNearestToMouse();
  uVar15 = (ulong)(uint)elapsedTime;
  OpenSteer::OpenSteerDemo::updateCamera(currentTime,elapsedTime,pAVar3);
  if (OpenSteer::OpenSteerDemo::selectedVehicle != (AbstractVehicle *)0x0) {
    (*(pAVar3->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[8])(pAVar3);
    (this->gridCenter).x = (float)extraout_XMM0_Da;
    (this->gridCenter).y = (float)extraout_XMM0_Db;
    (this->gridCenter).z = (float)uVar15;
  }
  local_1d0 = pAVar3;
  OpenSteer::OpenSteerDemo::gridUtility(&this->gridCenter);
  ppPVar12 = (this->crowd).
             super__Vector_base<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppPVar12 !=
      (this->crowd).
      super__Vector_base<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pPVar2 = *ppPVar12;
      OpenSteer::drawBasic2dCircularVehicle((AbstractVehicle *)pPVar2,(Color *)OpenSteer::gGray50);
      local_1b8 = OpenSteer::grayColor(0.7);
      uVar15 = local_1b8._8_8_;
      OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::drawTrail
                ((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)pPVar2,
                 &local_1b8,(Color *)OpenSteer::gWhite);
      ppPVar12 = ppPVar12 + 1;
    } while (ppPVar12 !=
             (this->crowd).
             super__Vector_base<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_208 = this;
  pPVar9 = getTestPath();
  iVar8 = (*(pPVar9->super_SegmentedPathway).super_Pathway._vptr_Pathway[8])(pPVar9);
  if (1 < CONCAT44(extraout_var,iVar8)) {
    uVar14 = 1;
    do {
      (*(pPVar9->super_SegmentedPathway).super_Pathway._vptr_Pathway[9])(pPVar9,uVar14);
      CVar6 = local_1b8;
      local_1b8.g_ = (float)extraout_XMM0_Db_00;
      local_1b8.r_ = (float)extraout_XMM0_Da_00;
      local_1b8.a_ = CVar6.a_;
      local_1b8.b_ = (float)(int)uVar15;
      (*(pPVar9->super_SegmentedPathway).super_Pathway._vptr_Pathway[9])(pPVar9,uVar14 - 1);
      local_218.b_ = (float)uVar15;
      OpenSteer::drawLine((Vec3 *)&local_1b8,(Vec3 *)&local_218,(Color *)OpenSteer::gRed);
      iVar8 = (*(pPVar9->super_SegmentedPathway).super_Pathway._vptr_Pathway[8])(pPVar9);
      uVar14 = uVar14 + 1;
    } while (uVar14 < CONCAT44(extraout_var_00,iVar8));
  }
  uVar4 = (anonymous_namespace)::gObstacle1._12_4_;
  if (OpenSteer::updatePhaseActive == '\x01') {
    OpenSteer::warnIfInUpdatePhase2("drawXZCircle");
  }
  OpenSteer::drawXZCircleOrDisk
            ((float)uVar4,(Vec3 *)((anonymous_namespace)::gObstacle1 + 0x10),
             (Color *)OpenSteer::gWhite,0x28,false);
  pAVar3 = local_1d0;
  uVar4 = (anonymous_namespace)::gObstacle2._12_4_;
  if (OpenSteer::updatePhaseActive == '\x01') {
    OpenSteer::warnIfInUpdatePhase2("drawXZCircle");
  }
  OpenSteer::drawXZCircleOrDisk
            ((float)uVar4,(Vec3 *)((anonymous_namespace)::gObstacle2 + 0x10),
             (Color *)OpenSteer::gWhite,0x28,false);
  CVar6 = local_1b8;
  fVar18 = (float)(anonymous_namespace)::gObstacle3._60_4_ * 0.5;
  fVar16 = fVar18 * (float)(anonymous_namespace)::gObstacle3._12_8_;
  fVar17 = fVar18 * SUB84((anonymous_namespace)::gObstacle3._12_8_,4);
  local_1b8.g_ = SUB84((anonymous_namespace)::gObstacle3._48_8_,4) + fVar17;
  local_1b8.r_ = (float)(anonymous_namespace)::gObstacle3._48_8_ + fVar16;
  local_1b8.a_ = CVar6.a_;
  local_1b8.b_ = (float)(anonymous_namespace)::gObstacle3._56_4_ +
                 (float)(anonymous_namespace)::gObstacle3._20_4_ * fVar18;
  local_218.b_ = (float)(anonymous_namespace)::gObstacle3._56_4_ -
                 (float)(anonymous_namespace)::gObstacle3._20_4_ * fVar18;
  local_218.g_ = SUB84((anonymous_namespace)::gObstacle3._48_8_,4) - fVar17;
  local_218.r_ = (float)(anonymous_namespace)::gObstacle3._48_8_ - fVar16;
  OpenSteer::drawLine((Vec3 *)&local_1b8,(Vec3 *)&local_218,(Color *)OpenSteer::gWhite);
  local_218.g_ = fVar18;
  local_218.r_ = fVar18;
  local_218.b_ = 0.0;
  VVar19 = OpenSteer::LocalSpaceMixin<OpenSteer::Obstacle>::globalizeDirection
                     ((LocalSpaceMixin<OpenSteer::Obstacle> *)(anonymous_namespace)::gObstacle3,
                      (Vec3 *)&local_218);
  local_1b8.g_ = SUB84((anonymous_namespace)::gObstacle3._48_8_,4) + VVar19.y;
  local_1b8.r_ = (float)(anonymous_namespace)::gObstacle3._48_8_ + VVar19.x;
  local_1b8.b_ = VVar19.z + (float)(anonymous_namespace)::gObstacle3._56_4_;
  local_228.y = fVar18;
  local_228.x = -fVar18;
  local_228.z = 0.0;
  VVar19 = OpenSteer::LocalSpaceMixin<OpenSteer::Obstacle>::globalizeDirection
                     ((LocalSpaceMixin<OpenSteer::Obstacle> *)(anonymous_namespace)::gObstacle3,
                      &local_228);
  local_218.b_ = VVar19.z + (float)(anonymous_namespace)::gObstacle3._56_4_;
  local_218.g_ = SUB84((anonymous_namespace)::gObstacle3._48_8_,4) + VVar19.y;
  local_218.r_ = (float)(anonymous_namespace)::gObstacle3._48_8_ + VVar19.x;
  local_1c8._0_8_ = CONCAT44(fVar18,fVar18) ^ 0x8000000080000000;
  local_1c8.z = 0.0;
  VVar19 = OpenSteer::LocalSpaceMixin<OpenSteer::Obstacle>::globalizeDirection
                     ((LocalSpaceMixin<OpenSteer::Obstacle> *)(anonymous_namespace)::gObstacle3,
                      &local_1c8);
  local_228.z = VVar19.z + (float)(anonymous_namespace)::gObstacle3._56_4_;
  local_228.y = SUB84((anonymous_namespace)::gObstacle3._48_8_,4) + VVar19.y;
  local_228.x = (float)(anonymous_namespace)::gObstacle3._48_8_ + VVar19.x;
  local_3c.z = 0.0;
  local_3c.x = fVar18;
  local_3c.y = -fVar18;
  VVar19 = OpenSteer::LocalSpaceMixin<OpenSteer::Obstacle>::globalizeDirection
                     ((LocalSpaceMixin<OpenSteer::Obstacle> *)(anonymous_namespace)::gObstacle3,
                      &local_3c);
  local_1c8.z = VVar19.z + (float)(anonymous_namespace)::gObstacle3._56_4_;
  uVar15 = (ulong)(uint)local_1c8.z;
  local_1c8.y = SUB84((anonymous_namespace)::gObstacle3._48_8_,4) + VVar19.y;
  local_1c8.x = (float)(anonymous_namespace)::gObstacle3._48_8_ + VVar19.x;
  OpenSteer::drawLine((Vec3 *)&local_1b8,(Vec3 *)&local_218,(Color *)OpenSteer::gWhite);
  OpenSteer::drawLine((Vec3 *)&local_218,&local_228,(Color *)OpenSteer::gWhite);
  OpenSteer::drawLine(&local_228,&local_1c8,(Color *)OpenSteer::gWhite);
  OpenSteer::drawLine(&local_1c8,(Vec3 *)&local_1b8,(Color *)OpenSteer::gWhite);
  OpenSteer::OpenSteerDemo::highlightVehicleUtility(local_200);
  if ((OpenSteer::enableAnnotation == '\x01') &&
     (ppPVar12 = (local_208->crowd).
                 super__Vector_base<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
     ppPVar12 !=
     (local_208->crowd).
     super__Vector_base<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    do {
      fVar17 = (float)uVar15;
      pPVar2 = *ppPVar12;
      (*(pPVar2->super_SimpleVehicle).super_SimpleVehicle_3.
        super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
        super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
        super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(pPVar2);
      fVar16 = fVar17;
      if (local_200 == (AbstractVehicle *)0x0) {
        local_1e8 = 0;
        uStack_1e0 = 0;
        local_1f8 = local_1f8 & 0xffffffff00000000;
      }
      else {
        (*(local_200->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[8])();
        local_1e8 = CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
        uStack_1e0 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
        local_1f8 = CONCAT44(local_1f8._4_4_,fVar16);
      }
      (*(pAVar3->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[8])(pAVar3);
      if ((SQRT((fVar17 - fVar16) * (fVar17 - fVar16) +
                (extraout_XMM0_Da_01 - extraout_XMM0_Da_03) *
                (extraout_XMM0_Da_01 - extraout_XMM0_Da_03) +
                (extraout_XMM0_Db_01 - extraout_XMM0_Db_03) *
                (extraout_XMM0_Db_01 - extraout_XMM0_Db_03)) < 6.0) ||
         (uVar15 = 0x40c00000,
         SQRT((fVar17 - (float)local_1f8) * (fVar17 - (float)local_1f8) +
              (extraout_XMM0_Da_01 - (float)local_1e8) * (extraout_XMM0_Da_01 - (float)local_1e8) +
              (extraout_XMM0_Db_01 - local_1e8._4_4_) * (extraout_XMM0_Db_01 - local_1e8._4_4_)) <
         6.0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"#",1);
        cVar7 = std::ostream::operator<<
                          ((ostream *)&local_1b8,
                           *(int *)&(pPVar2->super_SimpleVehicle).super_SimpleVehicle_3.field_0x94);
        std::ostream::put(cVar7);
        fVar16 = 1.0;
        OpenSteer::Color::Color(&local_218,0.8,1.0,0.8,1.0);
        (*(pPVar2->super_SimpleVehicle).super_SimpleVehicle_3.
          super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
          super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
          super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(pPVar2);
        local_228.z = fVar16 + 0.0;
        local_228.y = extraout_XMM0_Db_04 + 0.25;
        local_228.x = extraout_XMM0_Da_04 + 0.0;
        fVar16 = OpenSteer::drawGetWindowWidth();
        fVar17 = OpenSteer::drawGetWindowHeight();
        uVar15 = (ulong)(uint)fVar17;
        OpenSteer::draw2dTextAt3dLocation
                  ((ostringstream *)&local_1b8,&local_228,&local_218,fVar16,fVar17);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b8);
        std::ios_base::~ios_base(local_148);
      }
      ppPVar12 = ppPVar12 + 1;
    } while (ppPVar12 !=
             (local_208->crowd).
             super__Vector_base<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((OpenSteer::OpenSteerDemo::selectedVehicle != (AbstractVehicle *)0x0) &&
     (OpenSteer::enableAnnotation == '\x01')) {
    fVar16 = 0.8;
    OpenSteer::Color::Color(&local_218,0.8,0.8,1.0,1.0);
    (*(pAVar3->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[8])(pAVar3);
    local_228.z = fVar16 + 0.0;
    local_228.y = extraout_XMM0_Db_05 + 0.25;
    local_228.x = extraout_XMM0_Da_05 + 0.0;
    local_1f8._0_4_ = OpenSteer::OpenSteerDemo::camera.super_LocalSpace._position.x;
    local_1f8._4_4_ = OpenSteer::OpenSteerDemo::camera.super_LocalSpace._position.y;
    uStack_1f0 = 0;
    local_1e8 = CONCAT44(local_1e8._4_4_,
                         OpenSteer::OpenSteerDemo::camera.super_LocalSpace._position.z);
    (*(pAVar3->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[8])(pAVar3);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
    *(undefined8 *)((long)&local_1b8.b_ + *(long *)(local_1b8._0_8_ + -0x18)) = 2;
    puVar1 = (uint *)((long)auStack_1a0 + *(long *)(local_1b8._0_8_ + -0x18));
    *puVar1 = *puVar1 | 4;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"      ",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"1: speed: ",10);
    (*(pAVar3->super_AbstractLocalSpace)._vptr_AbstractLocalSpace[0x1b])(pAVar3);
    poVar10 = std::ostream::_M_insert<double>((double)extraout_XMM0_Da_07);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    *(undefined8 *)((long)&local_1b8.b_ + *(long *)(local_1b8._0_8_ + -0x18)) = 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"      ",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"2: cam dist: ",0xd);
    poVar10 = std::ostream::_M_insert<double>
                        ((double)SQRT((fVar16 - (float)local_1e8) * (fVar16 - (float)local_1e8) +
                                      (extraout_XMM0_Da_06 - (float)local_1f8) *
                                      (extraout_XMM0_Da_06 - (float)local_1f8) +
                                      (extraout_XMM0_Db_06 - local_1f8._4_4_) *
                                      (extraout_XMM0_Db_06 - local_1f8._4_4_)));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"      ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8,"3: no third thing",0x11);
    std::ostream::put((char)&local_1b8);
    fVar16 = OpenSteer::drawGetWindowWidth();
    fVar17 = OpenSteer::drawGetWindowHeight();
    OpenSteer::draw2dTextAt3dLocation
              ((ostringstream *)&local_1b8,&local_228,&local_218,fVar16,fVar17);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b8);
    std::ios_base::~ios_base(local_148);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1b8,"[F1/F2] Crowd size: ",0x14);
  pPVar5 = local_208;
  std::ostream::operator<<((ostream *)&local_1b8,local_208->population);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"\n[F3] PD type: ",0xf);
  if (pPVar5->cyclePD == 0) {
    lVar11 = 0xe;
    pcVar13 = "LQ bin lattice";
  }
  else {
    if (pPVar5->cyclePD != 1) goto LAB_00129d57;
    lVar11 = 0xb;
    pcVar13 = "brute force";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,pcVar13,lVar11);
LAB_00129d57:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"\n[F4] ",6);
  pcVar13 = "Stay on the path.";
  if ((anonymous_namespace)::gUseDirectedPathFollowing != '\0') {
    pcVar13 = "Directed path following.";
  }
  lVar11 = 0x11;
  if ((anonymous_namespace)::gUseDirectedPathFollowing != '\0') {
    lVar11 = 0x18;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,pcVar13,lVar11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"\n[F5] Wander: ",0xe);
  pcVar13 = "no";
  if ((ulong)(anonymous_namespace)::gWanderSwitch != 0) {
    pcVar13 = "yes";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1b8,pcVar13,(ulong)(anonymous_namespace)::gWanderSwitch | 2);
  std::ios::widen((char)&local_1b8 + (char)*(undefined8 *)(local_1b8._0_8_ + -0x18));
  std::ostream::put((char)&local_1b8);
  std::ostream::flush();
  fVar16 = OpenSteer::drawGetWindowHeight();
  fVar17 = OpenSteer::drawGetWindowWidth();
  fVar18 = OpenSteer::drawGetWindowHeight();
  VVar19.y = fVar16 + -50.0;
  VVar19.x = 10.0;
  VVar19.z = 0.0;
  OpenSteer::draw2dTextAt2dLocation
            ((OpenSteer *)&local_1b8,(ostringstream *)OpenSteer::gGray80,VVar19,color,fVar17,fVar18)
  ;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b8);
  std::ios_base::~ios_base(local_148);
  return;
}

Assistant:

void redraw (const float currentTime, const float elapsedTime)
    {
        // selected Pedestrian (user can mouse click to select another)
        AbstractVehicle* selected = OpenSteerDemo::selectedVehicle;
        
        // Pedestrian nearest mouse (to be highlighted)
        AbstractVehicle* nearMouse = OpenSteerDemo::vehicleNearestToMouse ();
        
        // update camera
        OpenSteerDemo::updateCamera (currentTime, elapsedTime, selected);
        
        // draw "ground plane"
        if (OpenSteerDemo::selectedVehicle) gridCenter = selected->position();
        OpenSteerDemo::gridUtility (gridCenter);
        
        // draw and annotate each Pedestrian
        for (iterator i = crowd.begin(); i != crowd.end(); i++) (**i).draw (); 
        
        // draw the path they follow and obstacles they avoid
        drawPathAndObstacles ();
        
        // highlight Pedestrian nearest mouse
        OpenSteerDemo::highlightVehicleUtility (nearMouse);
        
        // textual annotation (at the vehicle's screen position)
        serialNumberAnnotationUtility (selected, nearMouse);
        
        // textual annotation for selected Pedestrian
        if (OpenSteerDemo::selectedVehicle && OpenSteer::annotationIsOn())
        {
            const Color color (0.8f, 0.8f, 1.0f);
            const Vec3 textOffset (0, 0.25f, 0);
            const Vec3 textPosition = selected->position() + textOffset;
            const Vec3 camPosition = OpenSteerDemo::camera.position();
            const float camDistance = Vec3::distance (selected->position(),
                                                      camPosition);
            const char* spacer = "      ";
            std::ostringstream annote;
            annote << std::setprecision (2);
            annote << std::setiosflags (std::ios::fixed);
            annote << spacer << "1: speed: " << selected->speed() << std::endl;
            annote << std::setprecision (1);
            annote << spacer << "2: cam dist: " << camDistance << std::endl;
            annote << spacer << "3: no third thing" << std::ends;
            draw2dTextAt3dLocation (annote, textPosition, color, drawGetWindowWidth(), drawGetWindowHeight());
        }
        
        // display status in the upper left corner of the window
        std::ostringstream status;
        status << "[F1/F2] Crowd size: " << population;
        status << "\n[F3] PD type: ";
        switch (cyclePD)
        {
            case 0: status << "LQ bin lattice"; break;
            case 1: status << "brute force";    break;
        }
        status << "\n[F4] ";
        if (gUseDirectedPathFollowing)
            status << "Directed path following.";
        else
            status << "Stay on the path.";
        status << "\n[F5] Wander: ";
        if (gWanderSwitch) status << "yes"; else status << "no";
        status << std::endl;
        const float h = drawGetWindowHeight ();
        const Vec3 screenLocation (10, h-50, 0);
        draw2dTextAt2dLocation (status, screenLocation, gGray80, drawGetWindowWidth(), drawGetWindowHeight());
    }